

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::CLUFactor<double>::solveUright(CLUFactor<double> *this,double *wrk,double *vec)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  pointer pdVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  pointer pdVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  
  uVar10 = (ulong)(uint)this->thedim;
  piVar3 = (this->row).orig;
  piVar4 = (this->col).orig;
  pdVar5 = (this->diag).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->u).col.start;
  piVar7 = (this->u).col.len;
  while (0 < (int)uVar10) {
    iVar1 = piVar3[uVar10 - 1];
    iVar2 = piVar4[uVar10 - 1];
    dVar13 = pdVar5[iVar1] * vec[iVar1];
    wrk[iVar2] = dVar13;
    vec[iVar1] = 0.0;
    uVar10 = uVar10 - 1;
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      lVar11 = (long)piVar6[iVar2];
      lVar12 = piVar7[iVar2] + lVar11;
      piVar8 = (this->u).col.idx;
      pdVar9 = (this->u).col.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; lVar11 < lVar12; lVar11 = lVar11 + 1) {
        iVar1 = piVar8[lVar11];
        vec[iVar1] = vec[iVar1] - pdVar9[lVar11] * dVar13;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUright(R* wrk, R* vec) const
{

   for(int i = thedim - 1; i >= 0; i--)
   {
      int  r = row.orig[i];
      int  c = col.orig[i];
      R x = wrk[c] = diag[r] * vec[r];

      vec[r] = 0.0;

      if(x != 0.0)
         //if (isNotZero(x))
      {
         for(int j = u.col.start[c]; j < u.col.start[c] + u.col.len[c]; j++)
            vec[u.col.idx[j]] -= x * u.col.val[j];
      }
   }
}